

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_encode(opj_j2k_t *j2k,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  OPJ_UINT32 OVar10;
  opj_cp_t *cp;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  opj_cio_t *poVar13;
  opj_codestream_info_t *cstr_info_00;
  opj_image_t *poVar14;
  opj_cp_t *poVar15;
  char *__s;
  opj_tp_info_t *poVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  opj_tile_info_t *poVar24;
  int *piVar25;
  opj_marker_info_t *poVar26;
  size_t sVar27;
  opj_tcd_t *tcd;
  ulong uVar28;
  int iVar29;
  unsigned_long_long v;
  int iVar30;
  long lVar31;
  
  j2k->cio = cio;
  j2k->image = image;
  cp = j2k->cp;
  j2k->cstr_info = cstr_info;
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar18 = cp->tw;
    iVar19 = cp->th;
    poVar24 = (opj_tile_info_t *)malloc((long)(iVar19 * iVar18) * 0x260);
    cstr_info->tile = poVar24;
    uVar2 = image->x1;
    uVar4 = image->y1;
    uVar3 = image->x0;
    uVar5 = image->y0;
    cstr_info->image_w = uVar2 - uVar3;
    cstr_info->image_h = uVar4 - uVar5;
    poVar11 = cp->tcps;
    cstr_info->prog = poVar11->prg;
    cstr_info->tw = iVar18;
    cstr_info->th = iVar19;
    uVar6 = cp->tx0;
    uVar7 = cp->ty0;
    uVar8 = cp->tdx;
    uVar9 = cp->tdy;
    cstr_info->tile_x = uVar8;
    cstr_info->tile_y = uVar9;
    cstr_info->tile_Ox = uVar6;
    cstr_info->tile_Oy = uVar7;
    uVar20 = image->numcomps;
    cstr_info->numcomps = uVar20;
    cstr_info->numlayers = poVar11->numlayers;
    piVar25 = (int *)malloc((ulong)uVar20 << 2);
    cstr_info->numdecompos = piVar25;
    uVar20 = image->numcomps;
    if ((ulong)uVar20 != 0) {
      poVar12 = poVar11->tccps;
      uVar28 = 0;
      do {
        piVar25[uVar28] = poVar12->numresolutions - 1;
        uVar28 = uVar28 + 1;
      } while (uVar20 != uVar28);
    }
    cstr_info->D_max = 0.0;
    iVar18 = cio_tell(cio);
    cstr_info->main_head_start = iVar18;
    cstr_info->maxmarknum = 100;
    poVar26 = (opj_marker_info_t *)malloc(0x960);
    cstr_info->marker = poVar26;
    cstr_info->marknum = 0;
  }
  poVar13 = j2k->cio;
  cio_write(poVar13,0xff4f,2);
  cstr_info_00 = j2k->cstr_info;
  if (cstr_info_00 != (opj_codestream_info_t *)0x0) {
    iVar18 = cio_tell(poVar13);
    j2k_add_mhmarker(cstr_info_00,0xff4f,iVar18,0);
  }
  poVar13 = j2k->cio;
  poVar14 = j2k->image;
  poVar15 = j2k->cp;
  cio_write(poVar13,0xff51,2);
  iVar18 = cio_tell(poVar13);
  cio_skip(poVar13,2);
  cio_write(poVar13,(ulong)poVar15->rsiz,2);
  cio_write(poVar13,(ulong)poVar14->x1,4);
  cio_write(poVar13,(ulong)poVar14->y1,4);
  cio_write(poVar13,(ulong)poVar14->x0,4);
  cio_write(poVar13,(ulong)poVar14->y0,4);
  cio_write(poVar13,(long)poVar15->tdx,4);
  cio_write(poVar13,(long)poVar15->tdy,4);
  cio_write(poVar13,(long)poVar15->tx0,4);
  cio_write(poVar13,(long)poVar15->ty0,4);
  cio_write(poVar13,(ulong)poVar14->numcomps,2);
  if (poVar14->numcomps != 0) {
    lVar31 = 0;
    uVar28 = 0;
    do {
      cio_write(poVar13,(ulong)((*(int *)((long)&poVar14->comps->prec + lVar31) +
                                *(int *)((long)&poVar14->comps->sgnd + lVar31) * 0x80) - 1),1);
      cio_write(poVar13,(ulong)*(uint *)((long)&poVar14->comps->dx + lVar31),1);
      cio_write(poVar13,(ulong)*(uint *)((long)&poVar14->comps->dy + lVar31),1);
      uVar28 = uVar28 + 1;
      lVar31 = lVar31 + 0x38;
    } while (uVar28 < poVar14->numcomps);
  }
  iVar19 = cio_tell(poVar13);
  cio_seek(poVar13,iVar18);
  cio_write(poVar13,(long)(iVar19 - iVar18),2);
  cio_seek(poVar13,iVar19);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff51,iVar18,iVar19 - iVar18);
  }
  poVar13 = j2k->cio;
  cio_write(poVar13,0xff52,2);
  iVar19 = cio_tell(poVar13);
  cio_skip(poVar13,2);
  poVar11 = j2k->cp->tcps;
  iVar18 = j2k->curtileno;
  cio_write(poVar13,(long)poVar11[iVar18].csty,1);
  cio_write(poVar13,(long)poVar11[iVar18].prg,1);
  cio_write(poVar13,(long)poVar11[iVar18].numlayers,2);
  cio_write(poVar13,(long)poVar11[iVar18].mct,1);
  j2k_write_cox(j2k,0);
  iVar18 = cio_tell(poVar13);
  cio_seek(poVar13,iVar19);
  cio_write(poVar13,(long)(iVar18 - iVar19),2);
  cio_seek(poVar13,iVar18);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff52,iVar19,iVar18 - iVar19);
  }
  poVar13 = j2k->cio;
  cio_write(poVar13,0xff5c,2);
  iVar18 = cio_tell(poVar13);
  cio_skip(poVar13,2);
  j2k_write_qcx(j2k,0);
  uVar20 = cio_tell(poVar13);
  cio_seek(poVar13,iVar18);
  cio_write(poVar13,(long)(int)(uVar20 - iVar18),2);
  uVar28 = (ulong)uVar20;
  cio_seek(poVar13,uVar20);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    uVar28 = 0xff5c;
    j2k_add_mhmarker(j2k->cstr_info,0xff5c,iVar18,uVar20 - iVar18);
  }
  if ((cp->cinema != OFF) && (1 < image->numcomps)) {
    uVar20 = 1;
    do {
      j2k_write_coc(j2k,uVar20);
      uVar28 = (ulong)uVar20;
      j2k_write_qcc(j2k,uVar20);
      uVar20 = uVar20 + 1;
    } while (uVar20 < image->numcomps);
  }
  iVar18 = (int)uVar28;
  if (image->numcomps != 0) {
    lVar31 = 0x328;
    v = 0;
    do {
      if (*(int *)((long)cp->tcps->tccps->stepsizes + lVar31 + -0x1c) != 0) {
        poVar11 = j2k->cp->tcps;
        poVar13 = j2k->cio;
        OVar10 = j2k->image->numcomps;
        cio_write(poVar13,0xff5e,2);
        bVar17 = (int)OVar10 < 0x101;
        cio_write(poVar13,6 - (ulong)bVar17,2);
        cio_write(poVar13,v,2 - (uint)bVar17);
        cio_write(poVar13,0,1);
        uVar28 = (ulong)*(int *)((long)poVar11->tccps->stepsizes + lVar31 + -0x1c);
        cio_write(poVar13,uVar28,1);
      }
      iVar18 = (int)uVar28;
      v = v + 1;
      lVar31 = lVar31 + 0x438;
    } while (v < image->numcomps);
  }
  if ((cp->comment != (char *)0x0) && (__s = j2k->cp->comment, __s != (char *)0x0)) {
    poVar13 = j2k->cio;
    cio_write(poVar13,0xff64,2);
    iVar19 = cio_tell(poVar13);
    cio_skip(poVar13,2);
    cio_write(poVar13,1,2);
    if (*__s != '\0') {
      uVar20 = 1;
      uVar28 = 0;
      do {
        cio_write(poVar13,(long)__s[uVar28],1);
        uVar28 = (ulong)uVar20;
        sVar27 = strlen(__s);
        uVar20 = uVar20 + 1;
      } while (uVar28 < sVar27);
    }
    iVar18 = cio_tell(poVar13);
    iVar30 = iVar18 - iVar19;
    cio_seek(poVar13,iVar19);
    cio_write(poVar13,(long)iVar30,2);
    cio_seek(poVar13,iVar18);
    if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
      iVar18 = 0xff64;
      j2k_add_mhmarker(j2k->cstr_info,0xff64,iVar19,iVar30);
    }
  }
  iVar18 = j2k_calculate_tp(cp,iVar18,image,j2k);
  j2k->totnum_tp = iVar18;
  if (cp->cinema != OFF) {
    poVar13 = j2k->cio;
    iVar18 = cio_tell(poVar13);
    j2k->tlm_start = iVar18;
    cio_write(poVar13,0xff55,2);
    cio_write(poVar13,(long)j2k->totnum_tp * 5 + 4,2);
    cio_write(poVar13,0,1);
    cio_write(poVar13,0x50,1);
    cio_skip(poVar13,j2k->totnum_tp * 5);
    if (cp->cinema == CINEMA4K_24) {
      j2k_write_poc(j2k);
    }
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar18 = cio_tell(cio);
    cstr_info->main_head_end = iVar18 + -1;
  }
  tcd = tcd_create(j2k->cinfo);
  if (0 < cp->th * cp->tw) {
    lVar31 = 0;
    do {
      poVar11 = cp->tcps;
      lVar1 = lVar31 + 1;
      opj_event_msg(j2k->cinfo,4,"tile number %d / %d\n");
      iVar18 = (int)lVar31;
      j2k->curtileno = iVar18;
      j2k->cur_tp_num = 0;
      tcd->cur_totnum_tp = j2k->cur_totnum_tp[lVar31];
      if (lVar31 == 0) {
        tcd_malloc_encode(tcd,image,cp,0);
      }
      else {
        tcd_init_encode(tcd,image,cp,iVar18);
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        iVar30 = cio_tell(cio);
        poVar24 = cstr_info->tile;
        iVar19 = j2k->curtileno;
        poVar24[iVar19].start_pos = iVar30 + j2k->pos_correction;
        poVar24[iVar19].maxmarknum = 10;
        poVar26 = (opj_marker_info_t *)malloc(0xf0);
        poVar24[iVar19].marker = poVar26;
        poVar24[iVar19].marknum = 0;
      }
      if (-1 < poVar11[lVar31].numpocs) {
        iVar19 = 0;
        iVar30 = 0;
        do {
          tcd->cur_pino = iVar30;
          iVar21 = j2k_get_num_tp(cp,iVar30,iVar18);
          tcd->tp_pos = cp->tp_pos;
          if (0 < iVar21) {
            iVar29 = 0;
            do {
              j2k->tp_num = iVar29;
              if (cstr_info != (opj_codestream_info_t *)0x0) {
                iVar22 = cio_tell(cio);
                cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
                     iVar22 + j2k->pos_correction;
              }
              poVar13 = j2k->cio;
              iVar22 = cio_tell(poVar13);
              j2k->sot_start = iVar22;
              cio_write(poVar13,0xff90,2);
              iVar22 = cio_tell(poVar13);
              cio_skip(poVar13,2);
              cio_write(poVar13,(long)j2k->curtileno,2);
              cio_skip(poVar13,4);
              cio_write(poVar13,(long)j2k->cur_tp_num,1);
              cio_write(poVar13,(long)j2k->cur_totnum_tp[j2k->curtileno],1);
              iVar23 = cio_tell(poVar13);
              cio_seek(poVar13,iVar22);
              cio_write(poVar13,(long)(iVar23 - iVar22),2);
              cio_seek(poVar13,iVar23);
              if ((j2k->cstr_info != (opj_codestream_info_t *)0x0) && (j2k->cur_tp_num == 0)) {
                j2k_add_tlmarker(j2k->curtileno,j2k->cstr_info,0xff90,iVar22,iVar23 - iVar22);
              }
              if ((j2k->cur_tp_num == 0) && (cp->cinema == OFF)) {
                if (1 < image->numcomps) {
                  uVar20 = 1;
                  do {
                    j2k_write_coc(j2k,uVar20);
                    j2k_write_qcc(j2k,uVar20);
                    uVar20 = uVar20 + 1;
                  } while (uVar20 < image->numcomps);
                }
                if (cp->tcps[lVar31].numpocs != 0) {
                  j2k_write_poc(j2k);
                }
              }
              if (cstr_info == (opj_codestream_info_t *)0x0) {
                j2k_write_sod(j2k,tcd);
              }
              else {
                iVar22 = cio_tell(cio);
                cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
                     iVar22 + j2k->pos_correction + 1;
                j2k_write_sod(j2k,tcd);
                iVar23 = cio_tell(cio);
                poVar16 = cstr_info->tile[j2k->curtileno].tp;
                iVar22 = j2k->cur_tp_num;
                poVar16[iVar22].tp_end_pos = iVar23 + j2k->pos_correction + -1;
                poVar16[iVar22].tp_start_pack = iVar19;
                iVar23 = cstr_info->packno;
                poVar16[iVar22].tp_numpacks = iVar23 - iVar19;
                iVar19 = iVar23;
              }
              j2k->cur_tp_num = j2k->cur_tp_num + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar21);
          }
          bVar17 = iVar30 < poVar11[lVar31].numpocs;
          iVar30 = iVar30 + 1;
        } while (bVar17);
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        iVar18 = cio_tell(cio);
        cstr_info->tile[j2k->curtileno].end_pos = iVar18 + j2k->pos_correction + -1;
      }
      lVar31 = lVar1;
    } while (lVar1 < (long)cp->th * (long)cp->tw);
  }
  tcd_free_encode(tcd);
  tcd_destroy(tcd);
  free(j2k->cur_totnum_tp);
  cio_write(j2k->cio,0xffd9,2);
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar18 = cio_tell(cio);
    cstr_info->codestream_size = (iVar18 + j2k->pos_correction) - cstr_info->main_head_start;
  }
  return 1;
}

Assistant:

opj_bool j2k_encode(opj_j2k_t *j2k, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	int tileno, compno;
	opj_cp_t *cp = NULL;

	opj_tcd_t *tcd = NULL;	/* TCD component */

	j2k->cio = cio;	
	j2k->image = image;

	cp = j2k->cp;

	/* INDEX >> */
	j2k->cstr_info = cstr_info;
	if (cstr_info) {
		int compno;
		cstr_info->tile = (opj_tile_info_t *) opj_malloc(cp->tw * cp->th * sizeof(opj_tile_info_t));
		cstr_info->image_w = image->x1 - image->x0;
		cstr_info->image_h = image->y1 - image->y0;
		cstr_info->prog = (&cp->tcps[0])->prg;
		cstr_info->tw = cp->tw;
		cstr_info->th = cp->th;
		cstr_info->tile_x = cp->tdx;	/* new version parser */
		cstr_info->tile_y = cp->tdy;	/* new version parser */
		cstr_info->tile_Ox = cp->tx0;	/* new version parser */
		cstr_info->tile_Oy = cp->ty0;	/* new version parser */
		cstr_info->numcomps = image->numcomps;
		cstr_info->numlayers = (&cp->tcps[0])->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (compno=0; compno < image->numcomps; compno++) {
			cstr_info->numdecompos[compno] = (&cp->tcps[0])->tccps->numresolutions - 1;
		}
		cstr_info->D_max = 0.0;		/* ADD Marcela */
		cstr_info->main_head_start = cio_tell(cio); /* position of SOC */
		cstr_info->maxmarknum = 100;
		cstr_info->marker = (opj_marker_info_t *) opj_malloc(cstr_info->maxmarknum * sizeof(opj_marker_info_t));
		cstr_info->marknum = 0;
	}
	/* << INDEX */

	j2k_write_soc(j2k);
	j2k_write_siz(j2k);
	j2k_write_cod(j2k);
	j2k_write_qcd(j2k);

	if(cp->cinema){
		for (compno = 1; compno < image->numcomps; compno++) {
			j2k_write_coc(j2k, compno);
			j2k_write_qcc(j2k, compno);
		}
	}

	for (compno = 0; compno < image->numcomps; compno++) {
		opj_tcp_t *tcp = &cp->tcps[0];
		if (tcp->tccps[compno].roishift)
			j2k_write_rgn(j2k, compno, 0);
	}
	if (cp->comment != NULL) {
		j2k_write_com(j2k);
	}

	j2k->totnum_tp = j2k_calculate_tp(cp,image->numcomps,image,j2k);
	/* TLM Marker*/
	if(cp->cinema){
		j2k_write_tlm(j2k);
		if (cp->cinema == CINEMA4K_24) {
			j2k_write_poc(j2k);
		}
	}

	/* uncomment only for testing JPSEC marker writing */
	/* j2k_write_sec(j2k); */

	/* INDEX >> */
	if(cstr_info) {
		cstr_info->main_head_end = cio_tell(cio) - 1;
	}
	/* << INDEX */
	/**** Main Header ENDS here ***/

	/* create the tile encoder */
	tcd = tcd_create(j2k->cinfo);

	/* encode each tile */
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int pino;
		int tilepartno=0;
		/* UniPG>> */
		int acc_pack_num = 0;
		/* <<UniPG */


		opj_tcp_t *tcp = &cp->tcps[tileno];
		opj_event_msg(j2k->cinfo, EVT_INFO, "tile number %d / %d\n", tileno + 1, cp->tw * cp->th);

		j2k->curtileno = tileno;
		j2k->cur_tp_num = 0;
		tcd->cur_totnum_tp = j2k->cur_totnum_tp[j2k->curtileno];
		/* initialisation before tile encoding  */
		if (tileno == 0) {
			tcd_malloc_encode(tcd, image, cp, j2k->curtileno);
		} else {
			tcd_init_encode(tcd, image, cp, j2k->curtileno);
		}

		/* INDEX >> */
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].start_pos = cio_tell(cio) + j2k->pos_correction;
			cstr_info->tile[j2k->curtileno].maxmarknum = 10;
			cstr_info->tile[j2k->curtileno].marker = (opj_marker_info_t *) opj_malloc(cstr_info->tile[j2k->curtileno].maxmarknum * sizeof(opj_marker_info_t));
			cstr_info->tile[j2k->curtileno].marknum = 0;
		}
		/* << INDEX */

		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tot_num_tp;
			tcd->cur_pino=pino;

			/*Get number of tile parts*/
			tot_num_tp = j2k_get_num_tp(cp,pino,tileno);
			tcd->tp_pos = cp->tp_pos;

			for(tilepartno = 0; tilepartno < tot_num_tp ; tilepartno++){
				j2k->tp_num = tilepartno;
				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
					cio_tell(cio) + j2k->pos_correction;
				/* << INDEX */
				j2k_write_sot(j2k);

				if(j2k->cur_tp_num == 0 && cp->cinema == 0){
					for (compno = 1; compno < image->numcomps; compno++) {
						j2k_write_coc(j2k, compno);
						j2k_write_qcc(j2k, compno);
					}
					if (cp->tcps[tileno].numpocs) {
						j2k_write_poc(j2k);
					}
				}

				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
					cio_tell(cio) + j2k->pos_correction + 1;
				/* << INDEX */

				j2k_write_sod(j2k, tcd);

				/* INDEX >> */
				if(cstr_info) {
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_pos =
						cio_tell(cio) + j2k->pos_correction - 1;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pack =
						acc_pack_num;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_numpacks =
						cstr_info->packno - acc_pack_num;
					acc_pack_num = cstr_info->packno;
				}
				/* << INDEX */

				j2k->cur_tp_num++;
			}			
		}
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].end_pos = cio_tell(cio) + j2k->pos_correction - 1;
		}


		/*
		if (tile->PPT) { // BAD PPT !!! 
		FILE *PPT_file;
		int i;
		PPT_file=fopen("PPT","rb");
		fprintf(stderr,"%c%c%c%c",255,97,tile->len_ppt/256,tile->len_ppt%256);
		for (i=0;i<tile->len_ppt;i++) {
		unsigned char elmt;
		fread(&elmt, 1, 1, PPT_file);
		fwrite(&elmt,1,1,f);
		}
		fclose(PPT_file);
		unlink("PPT");
		}
		*/

	}

	/* destroy the tile encoder */
	tcd_free_encode(tcd);
	tcd_destroy(tcd);

	opj_free(j2k->cur_totnum_tp);

	j2k_write_eoc(j2k);

	if(cstr_info) {
		cstr_info->codestream_size = cio_tell(cio) + j2k->pos_correction;
		/* UniPG>> */
		/* The following adjustment is done to adjust the codestream size */
		/* if SOD is not at 0 in the buffer. Useful in case of JP2, where */
		/* the first bunch of bytes is not in the codestream              */
		cstr_info->codestream_size -= cstr_info->main_head_start;
		/* <<UniPG */
	}

#ifdef USE_JPWL
	/*
	preparation of JPWL marker segments
	*/
	if(cp->epc_on) {

		/* encode according to JPWL */
		jpwl_encode(j2k, cio, image);

	}
#endif /* USE_JPWL */

	return OPJ_TRUE;
}